

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::DataManReader::DoClose(DataManReader *this,int transportIndex)

{
  bool bVar1;
  undefined4 in_ESI;
  long in_RDI;
  string *in_stack_000002f8;
  DataManMonitor *in_stack_00000300;
  string *in_stack_000004a8;
  DataManMonitor *in_stack_000004b0;
  undefined4 in_stack_fffffffffffffff0;
  
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             SUB81((ulong)in_RDI >> 0x38,0));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             SUB81((ulong)in_RDI >> 0x38,0));
  bVar1 = std::thread::joinable((thread *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable((thread *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (bVar1) {
    std::thread::join();
  }
  *(undefined1 *)(in_RDI + 0x74) = 1;
  if ((*(byte *)(in_RDI + 0x118) & 1) != 0) {
    DataManMonitor::OutputCsv(in_stack_00000300,in_stack_000002f8);
    DataManMonitor::OutputJson(in_stack_000004b0,in_stack_000004a8);
  }
  return;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}